

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O2

void __thiscall
mio::basic_mmap<(mio::access_mode)0,_char>::map
          (basic_mmap<(mio::access_mode)0,_char> *this,handle_type handle,size_type offset,
          size_type length,error_code *error)

{
  size_t sVar1;
  error_category *peVar2;
  size_type length_00;
  mmap_context ctx;
  mmap_context local_40;
  
  std::error_code::clear(error);
  if (handle == -1) {
    peVar2 = (error_category *)std::_V2::generic_category();
    error->_M_value = 9;
  }
  else {
    sVar1 = detail::query_file_size(handle,error);
    if (error->_M_value != 0) {
      return;
    }
    if (length + offset <= sVar1) {
      length_00 = sVar1 - offset;
      if (length != 0) {
        length_00 = length;
      }
      detail::memory_map(&local_40,handle,offset,length_00,read,error);
      if (error->_M_value != 0) {
        return;
      }
      unmap(this);
      this->file_handle_ = handle;
      this->is_handle_internal_ = false;
      this->data_ = local_40.data;
      this->length_ = local_40.length;
      this->mapped_length_ = local_40.mapped_length;
      return;
    }
    peVar2 = (error_category *)std::_V2::generic_category();
    error->_M_value = 0x16;
  }
  error->_M_cat = peVar2;
  return;
}

Assistant:

void basic_mmap<AccessMode, ByteT>::map(const handle_type handle,
        const size_type offset, const size_type length, std::error_code& error)
{
    error.clear();
    if(handle == invalid_handle)
    {
        error = std::make_error_code(std::errc::bad_file_descriptor);
        return;
    }

    const auto file_size = detail::query_file_size(handle, error);
    if(error)
    {
        return;
    }

    if(offset + length > file_size)
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return;
    }

    const auto ctx = detail::memory_map(handle, offset,
            length == map_entire_file ? (file_size - offset) : length,
            AccessMode, error);
    if(!error)
    {
        // We must unmap the previous mapping that may have existed prior to this call.
        // Note that this must only be invoked after a new mapping has been created in
        // order to provide the strong guarantee that, should the new mapping fail, the
        // `map` function leaves this instance in a state as though the function had
        // never been invoked.
        unmap();
        file_handle_ = handle;
        is_handle_internal_ = false;
        data_ = reinterpret_cast<pointer>(ctx.data);
        length_ = ctx.length;
        mapped_length_ = ctx.mapped_length;
#ifdef _WIN32
        file_mapping_handle_ = ctx.file_mapping_handle;
#endif
    }
}